

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O2

bool __thiscall
HPack::Encoder::encodeResponse(Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  pointer pHVar1;
  bool bVar2;
  bool bVar3;
  HeaderField *field;
  pointer field_00;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_58._0_4_ = 2;
    local_44 = 0;
    local_58._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_40 = "default";
    bVar2 = false;
    QMessageLogger::debug((char *)&local_58,"empty header");
  }
  else {
    bVar2 = encodeResponsePseudoHeaders(this,outputStream,header);
    if (bVar2) {
      pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      for (field_00 = (header->
                      super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
                      _M_impl.super__Vector_impl_data._M_start; bVar2 = field_00 == pHVar1, !bVar2;
          field_00 = field_00 + 1) {
        local_58._0_4_ = 0x2487c9;
        local_58._4_4_ = 0;
        bVar3 = ::operator==(&field_00->name,(char **)&local_58);
        if (!bVar3) {
          bVar3 = encodeHeaderField(this,outputStream,field_00);
          if (!bVar3) break;
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Encoder::encodeResponse(BitOStream &outputStream, const HttpHeader &header)
{
    if (!header.size()) {
        qDebug("empty header");
        return false;
    }

    if (!encodeResponsePseudoHeaders(outputStream, header))
        return false;

    for (const auto &field : header) {
        if (field.name == ":status")
            continue;

        if (!encodeHeaderField(outputStream, field))
            return false;
    }

    return true;
}